

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O1

void __thiscall xe::xml::Parser::parseEntityValue(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  undefined8 extraout_RAX;
  long lVar4;
  size_type *psVar5;
  char cVar6;
  Parser *this_00;
  string entity;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 local_50 [32];
  
  paVar1 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::resize((ulong)&local_90,(char)(this->m_tokenizer).m_curTokenLen);
  if (0 < (this->m_tokenizer).m_curTokenLen) {
    lVar4 = 0;
    do {
      local_90._M_dataplus._M_p[lVar4] =
           (this->m_tokenizer).m_buf.m_buffer
           [((this->m_tokenizer).m_buf.m_back + (int)lVar4) % (this->m_tokenizer).m_buf.m_size];
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->m_tokenizer).m_curTokenLen);
  }
  lVar4 = 8;
  do {
    iVar2 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar2 == 0) {
      cVar6 = *(char *)((long)&getEntityValue(std::__cxx11::string_const&)::s_entities + lVar4);
      goto LAB_00113b48;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x58);
  cVar6 = '\0';
LAB_00113b48:
  if (cVar6 != '\0') {
    std::__cxx11::string::resize((ulong)&this->m_entityValue,'\x01');
    *(this->m_entityValue)._M_dataplus._M_p = cVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "Invalid entity \'",&local_90);
  this_00 = (Parser *)local_50;
  plVar3 = (long *)std::__cxx11::string::append((char *)this_00);
  local_70._M_dataplus._M_p = (pointer)*plVar3;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar5) {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70.field_2._8_8_ = plVar3[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar5;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  error(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::parseEntityValue (void)
{
	DE_ASSERT(m_state == STATE_ENTITY && m_tokenizer.getToken() == TOKEN_ENTITY);

	std::string entity;
	m_tokenizer.getTokenStr(entity);

	const char value = getEntityValue(entity);
	if (value == 0)
		error("Invalid entity '" + entity + "'");

	m_entityValue.resize(1);
	m_entityValue[0] = value;
}